

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  char tmp [50];
  
  pcVar2 = tmp + 0x31;
  tmp[0x31] = '\0';
  uVar1 = 0;
  iVar3 = 10;
  while ((iVar3 != 0 && ((int)uVar1 == 0))) {
    uVar1 = nanos % 10;
    nanos = nanos / 10;
    iVar3 = iVar3 + -1;
  }
  if (iVar3 != 0) {
    pcVar2 = tmp + 0x30;
    for (; 0 < iVar3; iVar3 = iVar3 + -1) {
      *pcVar2 = "0123456789"[uVar1];
      uVar1 = nanos % 10;
      pcVar2 = pcVar2 + -1;
      nanos = nanos / 10;
    }
    *pcVar2 = '.';
  }
  pcVar2 = format_int(pcVar2,sec);
  add_pax_attr(as,key,pcVar2);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}